

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.h
# Opt level: O2

void __thiscall
OpenSSLWrapper::SslServerContext::SslServerContext(SslServerContext *this,SslServerContext *src)

{
  (this->super_SslContext).m_strCertComName._M_dataplus._M_p =
       (pointer)&(this->super_SslContext).m_strCertComName.field_2;
  (this->super_SslContext).m_strCertComName._M_string_length = 0;
  (this->super_SslContext).m_strCertComName.field_2._M_local_buf[0] = '\0';
  (this->super_SslContext).m_vstrAltNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_SslContext).m_vstrAltNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_SslContext).m_vstrAltNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_SslContext).m_ctx = (src->super_SslContext).m_ctx;
  (src->super_SslContext).m_ctx = (SSL_CTX *)0x0;
  (this->super_SslContext)._vptr_SslContext = (_func_int **)&PTR__SslServerContext_001450f8;
  (this->m_vstrAlpnProtoList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vstrAlpnProtoList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vstrAlpnProtoList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_SslContext).m_strCertComName,
             (string *)&(src->super_SslContext).m_strCertComName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&(this->super_SslContext).m_vstrAltNames,&(src->super_SslContext).m_vstrAltNames)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->m_vstrAlpnProtoList,&src->m_vstrAlpnProtoList);
  return;
}

Assistant:

explicit SslServerContext(SslServerContext&& src) noexcept : SslContext(move(src))
        {
            m_strCertComName = move(src.m_strCertComName);
            m_vstrAltNames = move(src.m_vstrAltNames);
            m_vstrAlpnProtoList = move(src.m_vstrAlpnProtoList);
        }